

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_38e3a9::QualifiedName::printLeft(QualifiedName *this,OutputStream *S)

{
  StringView R;
  
  Node::print(this->Qualifier,S);
  R.Last = "";
  R.First = "::";
  OutputStream::operator+=(S,R);
  Node::print(this->Name,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    Qualifier->print(S);
    S += "::";
    Name->print(S);
  }